

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setImageLimited<float>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  setSize(this,a->width,a->height,(long)a->depth);
  iVar4 = this->depth;
  if (0 < iVar4) {
    lVar2 = this->height;
    lVar1 = 0;
    do {
      if (0 < lVar2) {
        lVar5 = this->width;
        lVar3 = 0;
        do {
          if (0 < lVar5) {
            lVar2 = 0;
            do {
              iVar4 = (int)a->img[lVar1][lVar3][lVar2];
              if (0xfe < iVar4) {
                iVar4 = 0xff;
              }
              if (iVar4 < 1) {
                iVar4 = 0;
              }
              this->img[lVar1][lVar3][lVar2] = (uchar)iVar4;
              lVar2 = lVar2 + 1;
              lVar5 = this->width;
            } while (lVar2 < lVar5);
            lVar2 = this->height;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < lVar2);
        iVar4 = this->depth;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < iVar4);
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }